

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausInductiveClauses(Clu_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  sat_solver *psVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  char *__s;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int local_40;
  
  p->fFail = 0;
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,p->nFrames + 1,0);
  p->pSatMain = psVar6;
  if (psVar6 != (sat_solver *)0x0) {
    Fra_ClausSimInfoClean(p);
    iVar10 = p->pCnf->nVars * 2;
    iVar4 = p->nFrames;
    if (0 < iVar4) {
      piVar2 = p->vLitsProven->pArray;
      iVar9 = 0;
      do {
        pVVar7 = p->vClausesProven;
        if (0 < pVVar7->nSize) {
          lVar11 = 0;
          iVar4 = 0;
          do {
            iVar5 = pVVar7->pArray[lVar11];
            if (p->nLutSize < iVar5 - iVar4) {
              __assert_fail("End - Beg <= p->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                            ,0x47c,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
            }
            iVar4 = sat_solver_addclause(p->pSatMain,piVar2 + iVar4,piVar2 + iVar5);
            if (iVar4 == 0) goto LAB_0065b394;
            lVar11 = lVar11 + 1;
            pVVar7 = p->vClausesProven;
            iVar4 = iVar5;
          } while (lVar11 < pVVar7->nSize);
        }
        pVVar7 = p->vLitsProven;
        if (0 < pVVar7->nSize) {
          piVar3 = pVVar7->pArray;
          lVar11 = 0;
          do {
            piVar3[lVar11] = piVar3[lVar11] + iVar10;
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar7->nSize);
        }
        iVar9 = iVar9 + 1;
        iVar4 = p->nFrames;
      } while (iVar9 < iVar4);
    }
    pVVar7 = p->vLitsProven;
    if (0 < pVVar7->nSize) {
      piVar2 = pVVar7->pArray;
      lVar11 = 0;
      do {
        piVar2[lVar11] = piVar2[lVar11] - iVar4 * iVar10;
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar7->nSize);
    }
    iVar4 = p->pCnf->nVars * 2;
    piVar2 = p->vLits->pArray;
    if (0 < p->nFrames) {
      iVar10 = 0;
      do {
        pVVar7 = p->vClauses;
        if (0 < pVVar7->nSize) {
          lVar11 = 0;
          iVar9 = 0;
          do {
            if (p->vCosts->nSize <= lVar11) goto LAB_0065b606;
            iVar5 = pVVar7->pArray[lVar11];
            iVar1 = p->vCosts->pArray[lVar11];
            if (iVar1 != -1) {
              if (iVar1 < 1) {
                __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x4af,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              if (p->nLutSize < iVar5 - iVar9) {
                __assert_fail("End - Beg <= p->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x4b0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              iVar9 = sat_solver_addclause(p->pSatMain,piVar2 + iVar9,piVar2 + iVar5);
              if (iVar9 == 0) goto LAB_0065b394;
            }
            lVar11 = lVar11 + 1;
            pVVar7 = p->vClauses;
            iVar9 = iVar5;
          } while (lVar11 < pVVar7->nSize);
        }
        pVVar7 = p->vLits;
        if (0 < pVVar7->nSize) {
          piVar3 = pVVar7->pArray;
          lVar11 = 0;
          do {
            piVar3[lVar11] = piVar3[lVar11] + iVar4;
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar7->nSize);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < p->nFrames);
    }
    psVar6 = p->pSatMain;
    if (psVar6->qtail != psVar6->qhead) {
      iVar10 = sat_solver_simplify(psVar6);
      if (iVar10 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c3,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c4,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    if (p->fTarget != 0) {
      iVar10 = Fra_ClausRunSat0(p);
      if (iVar10 == 0) {
        if (p->fVerbose != 0) {
          printf(" Property fails.  ");
        }
        p->fFail = 1;
      }
      else if (p->fVerbose != 0) {
        printf(" Property holds.  ");
      }
    }
    psVar6 = p->pSatMain;
    if (psVar6->qtail != psVar6->qhead) {
      iVar10 = sat_solver_simplify(psVar6);
      if (iVar10 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f1,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    pVVar7 = p->vClauses;
    if (pVVar7->nSize < 1) {
      local_40 = 0;
    }
    else {
      lVar11 = 0;
      local_40 = 0;
      iVar10 = 0;
      do {
        if (p->vCosts->nSize <= lVar11) {
LAB_0065b606:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = pVVar7->pArray[lVar11];
        iVar5 = p->vCosts->pArray[lVar11];
        if (iVar5 != -1) {
          if (iVar5 < 1) {
            __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x4ff,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          if (p->nLutSize < iVar9 - iVar10) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x500,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          lVar13 = (long)iVar10;
          iVar5 = Fra_ClausSimInfoCheck(p,piVar2 + lVar13,iVar9 - iVar10);
          if (iVar5 == 0) {
            lVar12 = (long)iVar9;
            if (iVar10 < iVar9) {
              lVar8 = (long)iVar10;
              do {
                *(byte *)(piVar2 + lVar8) = *(byte *)(piVar2 + lVar8) ^ 1;
                lVar8 = lVar8 + 1;
              } while (lVar12 != lVar8);
            }
            iVar5 = sat_solver_solve(p->pSatMain,piVar2 + lVar13,piVar2 + lVar12,(long)p->nBTLimit,0
                                     ,0,0);
            if (iVar10 < iVar9) {
              do {
                *(byte *)(piVar2 + lVar13) = *(byte *)(piVar2 + lVar13) ^ 1;
                lVar13 = lVar13 + 1;
              } while (lVar12 != lVar13);
            }
            psVar6 = p->pSatMain;
            if (iVar5 == -1) {
              if (psVar6->qtail != psVar6->qhead) {
                iVar10 = sat_solver_simplify(psVar6);
                if (iVar10 == 0) {
                  __assert_fail("RetValue != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                                ,0x539,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
                }
                if (p->pSatMain->qtail != p->pSatMain->qhead) {
                  __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                                ,0x53a,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
                }
              }
              goto LAB_0065b54d;
            }
            Fra_ClausSimInfoRecord(p,psVar6->model + (long)p->pCnf->nVars * (long)p->nFrames);
            pVVar7 = p->vCosts;
            iVar10 = pVVar7->nSize;
          }
          else {
            pVVar7 = p->vCosts;
            iVar10 = pVVar7->nSize;
          }
          if (iVar10 <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar7->pArray[lVar11] = -1;
          local_40 = local_40 + 1;
        }
LAB_0065b54d:
        lVar11 = lVar11 + 1;
        pVVar7 = p->vClauses;
        iVar10 = iVar9;
      } while (lVar11 < pVVar7->nSize);
    }
    pVVar7 = p->vLits;
    if (pVVar7->nSize < 1) {
      return local_40;
    }
    iVar10 = p->nFrames;
    piVar2 = pVVar7->pArray;
    lVar11 = 0;
    do {
      piVar2[lVar11] = piVar2[lVar11] - iVar4 * iVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar7->nSize);
    return local_40;
  }
  __s = "Error: Main solver is unsat.";
LAB_0065b3a4:
  puts(__s);
  return -1;
LAB_0065b394:
  __s = "Error: Solver is UNSAT after adding assumption clauses.";
  goto LAB_0065b3a4;
}

Assistant:

int Fra_ClausInductiveClauses( Clu_Man_t * p )
{
//    Aig_Obj_t * pObjLi, * pObjLo;
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f, fFlag;//, Lits[2];
    p->fFail = 0;

    // reset the solver
    if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        return -1;
    }  
    Fra_ClausSimInfoClean( p );

/*
    // check if the property holds
    if ( Fra_ClausRunSat0( p ) )
        printf( "Property holds without strengthening.\n" );
    else
        printf( "Property does not hold without strengthening.\n" );
*/
/*
    // add constant registers
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )  
        if ( Aig_ObjFanin0(pObjLi) == Aig_ManConst1(p->pAig) )
        {
            for ( k = 0; k < p->nFrames; k++ )
            {
                Lits[0] = k * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObjLo->Id], Aig_ObjFaninC0(pObjLi) ); 
                RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
                if ( RetValue == 0 )
                {
                    printf( "Error: Solver is UNSAT after adding constant-register clauses.\n" );
                    return -1;
                }
            }
        }
*/


    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
            p->vLitsProven->pArray[i] += nLitsTot;
    }
    // return clauses back to normal
    nLitsTot = (p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
        p->vLitsProven->pArray[i] -= nLitsTot;

/*
    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    Beg = 0;
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        assert( End - Beg <= p->nLutSize );
        // add the clause to all timeframes
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
            return -1;
        }
        Beg = End;
    }
*/
    
    // add the clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }
  
    // check if the property holds
    if ( p->fTarget )
    {
        if ( Fra_ClausRunSat0( p ) )
        {
            if ( p->fVerbose )
            printf( " Property holds.  " );
        }
        else
        {
            if ( p->fVerbose )
            printf( " Property fails.  " );
    //        return -2;
            p->fFail = 1;
        }
    }

/*
    // add the property for the first K frames
    for ( i = 0; i < p->nFrames; i++ )
    {
        Aig_Obj_t * pObj;
        int Lits[2];
        // set the output literals
        pObj = Aig_ManCo(p->pAig, 0);
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding property for the first K frames.\n" );
            return -1;
        }
    }
*/

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }


    // check the clause in the last timeframe
    Beg = 0;
    Counter = 0;
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );

        if ( Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg) )
        {
            fFlag = 1;
//            printf( "s-" );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
        else
        {
            fFlag = 0;
//            printf( "s?" );
        }

        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );
        RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );

        // the problem is not solved
        if ( RetValue != l_False )
        {
//            printf( "S- " );
//            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model.ptr + p->nFrames * p->pCnf->nVars );
            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model + p->nFrames * p->pCnf->nVars );
//            RetValue = Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg);
//            assert( RetValue );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
//        printf( "S+ " );
//        assert( !fFlag );

/*
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding proved clauses.\n" );
            return -1;
        }
*/
        Beg = End;

        // simplify the solver
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // return clauses back to normal
    nLitsTot = p->nFrames * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;

//    if ( fFail )
//        return -2;
    return Counter;
}